

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

bool __thiscall cmLinkedTree<cmDefinitions>::iterator::operator==(iterator *this,iterator other)

{
  size_type sVar1;
  size_type sVar2;
  iterator *this_local;
  iterator other_local;
  
  if (this->Tree == (cmLinkedTree<cmDefinitions> *)0x0) {
    __assert_fail("this->Tree",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                  ,0x68,
                  "bool cmLinkedTree<cmDefinitions>::iterator::operator==(iterator) const [T = cmDefinitions]"
                 );
  }
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->Tree->UpPositions)
  ;
  sVar2 = std::vector<cmDefinitions,_std::allocator<cmDefinitions>_>::size(&this->Tree->Data);
  if (sVar1 == sVar2) {
    if (this->Tree == other.Tree) {
      return this->Position == other.Position;
    }
    __assert_fail("this->Tree == other.Tree",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                  ,0x6a,
                  "bool cmLinkedTree<cmDefinitions>::iterator::operator==(iterator) const [T = cmDefinitions]"
                 );
  }
  __assert_fail("this->Tree->UpPositions.size() == this->Tree->Data.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                ,0x69,
                "bool cmLinkedTree<cmDefinitions>::iterator::operator==(iterator) const [T = cmDefinitions]"
               );
}

Assistant:

bool operator==(iterator other) const
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      assert(this->Tree == other.Tree);
      return this->Position == other.Position;
    }